

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SwapChainGLImpl::SwapChainGLImpl
          (SwapChainGLImpl *this,IReferenceCounters *pRefCounters,EngineGLCreateInfo *InitAttribs,
          SwapChainDesc *SCDesc,RenderDeviceGLImpl *pRenderDeviceGL,
          DeviceContextGLImpl *pImmediateContextGL)

{
  TEXTURE_FORMAT TVar1;
  SURFACE_TRANSFORM SrfTransform;
  TEXTURE_FORMAT Format;
  TextureFormatAttribs *Args;
  char *pcVar2;
  char *local_b0;
  XWindowAttributes XWndAttribs;
  
  SwapChainGLBase<Diligent::ISwapChainGL>::SwapChainGLBase
            (&this->super_SwapChainGLBase<Diligent::ISwapChainGL>,pRefCounters,
             (IRenderDevice *)pRenderDeviceGL,(IDeviceContext *)pImmediateContextGL,SCDesc);
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  super_ObjectBase<Diligent::ISwapChainGL>.super_RefCountedObject<Diligent::ISwapChainGL>.
  super_ISwapChainGL.super_ISwapChain.super_IObject = (IObject)&PTR_QueryInterface_003d2a98;
  TVar1 = (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
          super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat;
  if (((TVar1 == TEX_FORMAT_BGRA8_UNORM_SRGB) || (TVar1 == TEX_FORMAT_RGBA8_UNORM_SRGB)) &&
     ((pRenderDeviceGL->m_GLCaps).FramebufferSRGB == false)) {
    Format = TEX_FORMAT_BGRA8_UNORM;
    if (TVar1 == TEX_FORMAT_RGBA8_UNORM_SRGB) {
      Format = TEX_FORMAT_RGBA8_UNORM;
    }
    Args = GetTextureFormatAttribs(Format);
    pcVar2 = " because sRGB framebuffers are not enabled.";
    FormatString<char[41],char_const*,char[44]>
              ((string *)&XWndAttribs,(Diligent *)"Changing the swap chain color format to ",
               (char (*) [41])Args,(char **)" because sRGB framebuffers are not enabled.",
               (char (*) [44])SCDesc);
    pImmediateContextGL = (DeviceContextGLImpl *)pcVar2;
    if (DebugMessageCallback != (undefined *)0x0) {
      pImmediateContextGL = (DeviceContextGLImpl *)0x0;
      (*(code *)DebugMessageCallback)(1,XWndAttribs._0_8_,0,0,0);
    }
    std::__cxx11::string::~string((string *)&XWndAttribs);
    (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
    super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat = Format;
  }
  SrfTransform = (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
                 super_SwapChainBase<Diligent::ISwapChainGL>.m_DesiredPreTransform;
  if (SURFACE_TRANSFORM_IDENTITY < SrfTransform) {
    local_b0 = GetSurfaceTransformString(SrfTransform);
    FormatString<char_const*,char[167]>
              ((string *)&XWndAttribs,(Diligent *)&local_b0,
               (char **)
               " is not an allowed pretransform because OpenGL swap chains only support identity transform. Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY."
               ,(char (*) [167])pImmediateContextGL);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,XWndAttribs._0_8_,0,0,0);
    }
    std::__cxx11::string::~string((string *)&XWndAttribs);
  }
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.PreTransform = SURFACE_TRANSFORM_IDENTITY;
  XGetWindowAttributes
            (*(undefined8 *)(InitAttribs + 0x80),*(undefined4 *)(InitAttribs + 0x78),&XWndAttribs);
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.Width = XWndAttribs.width;
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.Height = XWndAttribs.height;
  SwapChainGLBase<Diligent::ISwapChainGL>::CreateDummyBuffers
            (&this->super_SwapChainGLBase<Diligent::ISwapChainGL>,pRenderDeviceGL);
  return;
}

Assistant:

SwapChainGLImpl::SwapChainGLImpl(IReferenceCounters*       pRefCounters,
                                 const EngineGLCreateInfo& InitAttribs,
                                 const SwapChainDesc&      SCDesc,
                                 RenderDeviceGLImpl*       pRenderDeviceGL,
                                 DeviceContextGLImpl*      pImmediateContextGL) :
    // clang-format off
    TSwapChainGLBase
    {
        pRefCounters,
        pRenderDeviceGL,
        pImmediateContextGL,
        SCDesc
    }
// clang-format on
{
    if ((m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_RGBA8_UNORM_SRGB ||
         m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_BGRA8_UNORM_SRGB) &&
        !pRenderDeviceGL->GetGLCaps().FramebufferSRGB)
    {
        auto ColorFmt = m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_RGBA8_UNORM_SRGB ?
            TEX_FORMAT_RGBA8_UNORM :
            TEX_FORMAT_BGRA8_UNORM;
        LOG_WARNING_MESSAGE("Changing the swap chain color format to ", GetTextureFormatAttribs(ColorFmt).Name, " because sRGB framebuffers are not enabled.");
        m_SwapChainDesc.ColorBufferFormat = ColorFmt;
    }

    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL &&
        m_DesiredPreTransform != SURFACE_TRANSFORM_IDENTITY)
    {
        LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                            " is not an allowed pretransform because OpenGL swap chains only support identity transform. "
                            "Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY.");
    }
    m_DesiredPreTransform        = SURFACE_TRANSFORM_OPTIMAL;
    m_SwapChainDesc.PreTransform = SURFACE_TRANSFORM_IDENTITY;

#if PLATFORM_WIN32
    HWND hWnd = reinterpret_cast<HWND>(InitAttribs.Window.hWnd);
    RECT rc;
    GetClientRect(hWnd, &rc);
    m_SwapChainDesc.Width  = rc.right - rc.left;
    m_SwapChainDesc.Height = rc.bottom - rc.top;
#elif PLATFORM_LINUX
    auto wnd     = InitAttribs.Window.WindowId;
    auto display = reinterpret_cast<Display*>(InitAttribs.Window.pDisplay);

    XWindowAttributes XWndAttribs;
    XGetWindowAttributes(display, wnd, &XWndAttribs);

    m_SwapChainDesc.Width  = XWndAttribs.width;
    m_SwapChainDesc.Height = XWndAttribs.height;
#elif PLATFORM_ANDROID
    auto& GLContext        = pRenderDeviceGL->m_GLContext;
    m_SwapChainDesc.Width  = GLContext.GetScreenWidth();
    m_SwapChainDesc.Height = GLContext.GetScreenHeight();
#elif PLATFORM_MACOS
    //Set dummy width and height until resize is called by the app
    m_SwapChainDesc.Width  = 1024;
    m_SwapChainDesc.Height = 768;
#elif PLATFORM_WEB
    int32_t CanvasWidth  = 0;
    int32_t CanvasHeight = 0;
    emscripten_get_canvas_element_size(InitAttribs.Window.pCanvasId, &CanvasWidth, &CanvasHeight);
    m_SwapChainDesc.Width  = static_cast<uint32_t>(CanvasWidth);
    m_SwapChainDesc.Height = static_cast<uint32_t>(CanvasHeight);
#else
#    error Unsupported platform
#endif

    CreateDummyBuffers(pRenderDeviceGL);
}